

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O2

REF_STATUS ref_face_add_uniquely(REF_FACE ref_face,REF_INT *nodes)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  REF_INT *pRVar5;
  long lVar6;
  undefined8 uVar7;
  REF_STATUS ref_private_macro_code_rss;
  char *pcVar8;
  int iVar9;
  REF_INT local_34;
  
  uVar4 = ref_face_with(ref_face,nodes,&local_34);
  if (uVar4 != 0) {
    if (uVar4 == 5) {
      iVar9 = ref_face->n;
      iVar3 = ref_face->max;
      if (iVar9 < iVar3) {
        pRVar5 = ref_face->f2n;
      }
      else {
        iVar9 = 5000;
        if (5000 < (int)((double)iVar3 * 1.5)) {
          iVar9 = (int)((double)iVar3 * 1.5);
        }
        ref_face->max = iVar9 + iVar3;
        fflush(_stdout);
        if (ref_face->max < 1) {
          pRVar5 = ref_face->f2n;
        }
        else {
          pRVar5 = (REF_INT *)realloc(ref_face->f2n,(ulong)(uint)(ref_face->max << 2) << 2);
          ref_face->f2n = pRVar5;
        }
        if (pRVar5 == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",
                 0xbc,"ref_face_add_uniquely","realloc ref_face->f2n NULL");
          uVar2 = (long)ref_face->max * 4;
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar2 & 0xffffffff,uVar2
                 ,4,(long)ref_face->max << 4);
          return 2;
        }
        iVar9 = ref_face->n;
      }
      ref_face->n = iVar9 + 1;
      uVar1 = iVar9 * 4;
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        pRVar5[(int)uVar1 + lVar6] = nodes[lVar6];
      }
      lVar6 = 0;
      do {
        if (lVar6 == 3) {
          iVar3 = ref_face->f2n[(int)(uVar1 | 3)];
          if (ref_face->f2n[(int)uVar1] == iVar3) {
            return 0;
          }
          uVar4 = ref_adj_add(ref_face->adj,iVar3,iVar9);
          if (uVar4 == 0) {
            return 0;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",
                 0xcd,"ref_face_add_uniquely",(ulong)uVar4,"reg face node");
          return uVar4;
        }
        uVar4 = ref_adj_add(ref_face->adj,ref_face->f2n[(int)uVar1 + lVar6],iVar9);
        lVar6 = lVar6 + 1;
      } while (uVar4 == 0);
      pcVar8 = "reg face node";
      uVar7 = 200;
    }
    else {
      pcVar8 = "looking for face";
      uVar7 = 0xb6;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",uVar7,
           "ref_face_add_uniquely",(ulong)uVar4,pcVar8);
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_face_add_uniquely(REF_FACE ref_face, REF_INT *nodes) {
  REF_INT face, node;
  REF_STATUS status;

  status = ref_face_with(ref_face, nodes, &face);
  if (REF_SUCCESS == status) return REF_SUCCESS;
  if (REF_NOT_FOUND != status) RSS(status, "looking for face");

  if (ref_face_n(ref_face) >= ref_face_max(ref_face)) {
    REF_INT chunk;
    chunk = MAX(5000, (REF_INT)(1.5 * (REF_DBL)ref_face_max(ref_face)));
    ref_face_max(ref_face) += chunk;
    ref_realloc(ref_face->f2n, 4 * ref_face_max(ref_face), REF_INT);
  }

  face = ref_face_n(ref_face);
  ref_face_n(ref_face)++;

  for (node = 0; node < 4; node++)
    ref_face_f2n(ref_face, node, face) = nodes[node];

  for (node = 0; node < 3; node++)
    RSS(ref_adj_add(ref_face_adj(ref_face), ref_face_f2n(ref_face, node, face),
                    face),
        "reg face node");

  if (ref_face_f2n(ref_face, 0, face) != ref_face_f2n(ref_face, 3, face))
    RSS(ref_adj_add(ref_face_adj(ref_face), ref_face_f2n(ref_face, 3, face),
                    face),
        "reg face node");

  return REF_SUCCESS;
}